

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

SatInfo miniscript::internal::operator+(SatInfo *a,SatInfo *b)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long in_FS_OFFSET;
  SatInfo SVar4;
  
  if ((a->valid == true) && (b->valid == true)) {
    iVar3 = b->netdiff + a->exec;
    if (iVar3 < b->exec) {
      iVar3 = b->exec;
    }
    uVar2 = (ulong)(uint)(a->netdiff + b->netdiff) << 0x20;
    uVar1 = 1;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    iVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SVar4._0_8_ = uVar1 | uVar2;
    SVar4.exec = iVar3;
    return SVar4;
  }
  __stack_chk_fail();
}

Assistant:

SatInfo operator+(const SatInfo& a, const SatInfo& b) noexcept
    {
        // Concatenation with an empty set yields an empty set.
        if (!a.valid || !b.valid) return {};
        // Otherwise, the maximum stack size difference for the combined scripts is the sum of the
        // netdiffs, and the maximum stack size difference anywhere is either b.exec (if the
        // maximum occurred in b) or b.netdiff+a.exec (if the maximum occurred in a).
        return {a.netdiff + b.netdiff, std::max(b.exec, b.netdiff + a.exec)};
    }